

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O1

address __thiscall
pstore::index::
hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
::store_leaf_node<std::pair<pstore::uint128,pstore::extent<pstore::repo::compilation>>>
          (hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
           *this,transaction_base *transaction,
          pair<pstore::uint128,_pstore::extent<pstore::repo::compilation>_> *v,
          not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents)

{
  ulong uVar1;
  archive_result_type<pstore::serialize::archive::database_writer> aVar2;
  database_writer local_38;
  
  (*transaction->_vptr_transaction_base[2])(transaction,0,4);
  local_38.super_writer_base<pstore::serialize::archive::details::database_writer_policy>.
  bytes_consumed_ = 0;
  local_38.super_writer_base<pstore::serialize::archive::details::database_writer_policy>.flushed_ =
       false;
  local_38.super_writer_base<pstore::serialize::archive::details::database_writer_policy>.
  _vptr_writer_base = (_func_int **)&PTR__writer_base_0023bf68;
  local_38.super_writer_base<pstore::serialize::archive::details::database_writer_policy>.policy_.
  transaction_ = transaction;
  aVar2 = serialize::
          serializer<std::pair<pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_void>::
          write<pstore::serialize::archive::database_writer>(&local_38,v);
  local_38.super_writer_base<pstore::serialize::archive::details::database_writer_policy>.
  _vptr_writer_base = (_func_int **)&PTR__writer_base_0023bfb0;
  if (local_38.super_writer_base<pstore::serialize::archive::details::database_writer_policy>.
      flushed_ == false) {
    local_38.super_writer_base<pstore::serialize::archive::details::database_writer_policy>.flushed_
         = true;
  }
  if ((aVar2.a_ & 3) == 0) {
    uVar1 = (parents.ptr_)->elements_;
    if (uVar1 < 0xd) {
      (parents.ptr_)->elements_ = uVar1 + 1;
      ((parents.ptr_)->c_)._M_elems[uVar1].node.addr_.a_ = aVar2.a_;
      ((parents.ptr_)->c_)._M_elems[uVar1].position = 0xffffffffffffffff;
      return (address)aVar2.a_;
    }
    assert_failed("elements_ < Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                  ,100);
  }
  assert_failed("(result.absolute () & (aligned_to - 1U)) == 0U",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                ,0x2d5);
}

Assistant:

address hamt_map<KeyType, ValueType, Hash, KeyEqual>::store_leaf_node (
            transaction_base & transaction, OtherValueType const & v,
            gsl::not_null<parent_stack *> const parents) {

            // Make sure the alignment of leaf node is 4 to ensure that the two LSB are guaranteed
            // 0. If 'v' has greater alignment, serialize::write() will add additional padding.
            constexpr auto aligned_to = std::size_t{4};
            static_assert ((details::internal_node_bit | details::heap_node_bit) == aligned_to - 1,
                           "expected required alignment to be 4");
            transaction.allocate (0, aligned_to);

            // Now write the node and return where it went.
            address const result =
                serialize::write (serialize::archive::make_writer (transaction), v);
            PSTORE_ASSERT ((result.absolute () & (aligned_to - 1U)) == 0U);
            parents->push (details::parent_type{index_pointer{result}});

            return result;
        }